

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void hmac_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    __assert_fail("mode != PTLS_HASH_FINAL_MODE_SNAPSHOT || !\"not supported\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x13c4,"void hmac_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)");
  }
  if (md != (void *)0x0) {
    (**(code **)(_ctx[1].final + 8))(_ctx[1].final,md,1);
    hmac_apply_key((st_picotls_hmac_context_t *)_ctx,'\\');
    (**(code **)_ctx[1].final)(_ctx[1].final,md,*(undefined8 *)(_ctx[1].update + 8));
  }
  (**(code **)(_ctx[1].final + 8))(_ctx[1].final,md,mode);
  if (mode != PTLS_HASH_FINAL_MODE_RESET) {
    if (mode == PTLS_HASH_FINAL_MODE_FREE) {
      (*ptls_clear_memory)(&_ctx[1].clone_,*(size_t *)_ctx[1].update);
      free(_ctx);
      return;
    }
    __assert_fail("!\"FIXME\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x13d6,"void hmac_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)");
  }
  hmac_apply_key((st_picotls_hmac_context_t *)_ctx,'6');
  return;
}

Assistant:

static void hmac_final(ptls_hash_context_t *_ctx, void *md, ptls_hash_final_mode_t mode)
{
    struct st_picotls_hmac_context_t *ctx = (struct st_picotls_hmac_context_t *)_ctx;

    assert(mode != PTLS_HASH_FINAL_MODE_SNAPSHOT || !"not supported");

    if (md != NULL) {
        ctx->hash->final(ctx->hash, md, PTLS_HASH_FINAL_MODE_RESET);
        hmac_apply_key(ctx, 0x5c);
        ctx->hash->update(ctx->hash, md, ctx->algo->digest_size);
    }
    ctx->hash->final(ctx->hash, md, mode);

    switch (mode) {
    case PTLS_HASH_FINAL_MODE_FREE:
        ptls_clear_memory(ctx->key, ctx->algo->block_size);
        free(ctx);
        break;
    case PTLS_HASH_FINAL_MODE_RESET:
        hmac_apply_key(ctx, 0x36);
        break;
    default:
        assert(!"FIXME");
        break;
    }
}